

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O0

void __thiscall
MADPComponentDiscreteStates::MADPComponentDiscreteStates
          (MADPComponentDiscreteStates *this,size_t nrS)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  size_t in_stack_000000b8;
  MADPComponentDiscreteStates *in_stack_000000c0;
  
  *in_RDI = &PTR__MADPComponentDiscreteStates_00d3fad8;
  *(undefined1 *)(in_RDI + 1) = 0;
  in_RDI[2] = in_RSI;
  std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::vector
            ((vector<StateDiscrete,_std::allocator<StateDiscrete>_> *)0xad5af1);
  in_RDI[6] = 0;
  SetNrStates(in_stack_000000c0,in_stack_000000b8);
  *(undefined1 *)(in_RDI + 1) = 1;
  return;
}

Assistant:

MADPComponentDiscreteStates::MADPComponentDiscreteStates(size_t nrS) 
    :
        _m_initialized(false)
        ,_m_nrStates(nrS)
        ,_m_initialStateDistribution(0)
{
    SetNrStates(nrS);
    _m_initialized = true;
}